

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.c
# Opt level: O1

void av1_convolve_x_sr_avx2
               (uint8_t *src,int32_t src_stride,uint8_t *dst,int32_t dst_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined1 (*pauVar4) [32];
  int iVar5;
  undefined1 (*pauVar6) [16];
  uint8_t *puVar7;
  undefined1 (*pauVar8) [32];
  char cVar9;
  int j;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  undefined1 (*pauVar17) [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined2 uVar34;
  undefined1 auVar37 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [32];
  undefined1 auVar36 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  
  auVar69 = _DAT_0056c130;
  auVar18 = _DAT_0056c120;
  auVar36 = _DAT_0056c0e0;
  auVar35 = _DAT_00517c80;
  piVar1 = filter_params_x->filter_ptr;
  uVar12 = (ulong)((subpel_x_qn & 0xfU) * (uint)filter_params_x->taps);
  if (filter_params_x->taps == 0xc) {
    uVar2 = 7 - conv_params->round_0;
    auVar26 = ZEXT464(uVar2);
    uVar3 = *(undefined4 *)(piVar1 + uVar12);
    auVar113._4_4_ = uVar3;
    auVar113._0_4_ = uVar3;
    auVar113._8_4_ = uVar3;
    auVar113._12_4_ = uVar3;
    auVar113._16_4_ = uVar3;
    auVar113._20_4_ = uVar3;
    auVar113._24_4_ = uVar3;
    auVar113._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar1 + uVar12 + 2);
    auVar30._4_4_ = uVar3;
    auVar30._0_4_ = uVar3;
    auVar30._8_4_ = uVar3;
    auVar30._12_4_ = uVar3;
    auVar30._16_4_ = uVar3;
    auVar30._20_4_ = uVar3;
    auVar30._24_4_ = uVar3;
    auVar30._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar1 + uVar12 + 4);
    auVar111._4_4_ = uVar3;
    auVar111._0_4_ = uVar3;
    auVar111._8_4_ = uVar3;
    auVar111._12_4_ = uVar3;
    auVar111._16_4_ = uVar3;
    auVar111._20_4_ = uVar3;
    auVar111._24_4_ = uVar3;
    auVar111._28_4_ = uVar3;
    iVar5 = (1 << ((byte)uVar2 & 0x1f)) >> 1;
    uVar3 = *(undefined4 *)(piVar1 + uVar12 + 6);
    auVar47._4_4_ = uVar3;
    auVar47._0_4_ = uVar3;
    auVar47._8_4_ = uVar3;
    auVar47._12_4_ = uVar3;
    auVar47._16_4_ = uVar3;
    auVar47._20_4_ = uVar3;
    auVar47._24_4_ = uVar3;
    auVar47._28_4_ = uVar3;
    uVar3 = (undefined4)*(undefined8 *)(piVar1 + uVar12 + 8);
    auVar70._4_4_ = uVar3;
    auVar70._0_4_ = uVar3;
    auVar70._8_4_ = uVar3;
    auVar70._12_4_ = uVar3;
    auVar70._16_4_ = uVar3;
    auVar70._20_4_ = uVar3;
    auVar70._24_4_ = uVar3;
    auVar70._28_4_ = uVar3;
    uVar3 = (undefined4)((ulong)*(undefined8 *)(piVar1 + uVar12 + 8) >> 0x20);
    auVar83._4_4_ = uVar3;
    auVar83._0_4_ = uVar3;
    auVar83._8_4_ = uVar3;
    auVar83._12_4_ = uVar3;
    auVar83._16_4_ = uVar3;
    auVar83._20_4_ = uVar3;
    auVar83._24_4_ = uVar3;
    auVar83._28_4_ = uVar3;
    iVar16 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
    auVar94._4_4_ = iVar16;
    auVar94._0_4_ = iVar16;
    auVar94._8_4_ = iVar16;
    auVar94._12_4_ = iVar16;
    auVar94._16_4_ = iVar16;
    auVar94._20_4_ = iVar16;
    auVar94._24_4_ = iVar16;
    auVar94._28_4_ = iVar16;
    auVar102._4_4_ = iVar5;
    auVar102._0_4_ = iVar5;
    auVar102._8_4_ = iVar5;
    auVar102._12_4_ = iVar5;
    auVar102._16_4_ = iVar5;
    auVar102._20_4_ = iVar5;
    auVar102._24_4_ = iVar5;
    auVar102._28_4_ = iVar5;
    uVar11 = conv_params->round_0;
    if (w < 5) {
      if (0 < h) {
        pauVar6 = (undefined1 (*) [16])(src + -5);
        uVar12 = 0;
        do {
          auVar114._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
          auVar114._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
          auVar22 = vpunpcklbw_avx2(auVar114,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar39 = vpunpckhbw_avx2(auVar114,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar115 = vpshufd_avx2(auVar22,0xe6);
          auVar114 = vpshuflw_avx2(auVar115,0x50);
          auVar114 = vpshufhw_avx2(auVar114,0xfa);
          auVar28 = vpunpcklwd_avx2(auVar22,auVar22);
          auVar22 = vpalignr_avx2(auVar115,auVar28,2);
          auVar28 = vpalignr_avx2(auVar114,auVar28,10);
          auVar65 = vpunpcklwd_avx2(auVar39,auVar39);
          auVar115 = vpalignr_avx2(auVar39,auVar114,2);
          auVar114 = vpalignr_avx2(auVar65,auVar114,10);
          auVar39 = vpshufd_avx2(auVar39,0xe6);
          auVar45 = vpshuflw_avx2(auVar39,0x50);
          auVar45 = vpshufd_avx2(auVar45,0xf4);
          auVar39 = vpalignr_avx2(auVar39,auVar65,2);
          auVar45 = vpalignr_avx2(auVar45,auVar65,10);
          auVar115 = vpmaddwd_avx2(auVar115,auVar111);
          auVar114 = vpmaddwd_avx2(auVar114,auVar47);
          auVar115 = vpaddd_avx2(auVar115,auVar114);
          auVar114 = vpmaddwd_avx2(auVar39,auVar70);
          auVar39 = vpmaddwd_avx2(auVar45,auVar83);
          auVar114 = vpaddd_avx2(auVar114,auVar39);
          auVar22 = vpmaddwd_avx2(auVar22,auVar113);
          auVar28 = vpmaddwd_avx2(auVar30,auVar28);
          auVar22 = vpaddd_avx2(auVar22,auVar94);
          auVar22 = vpaddd_avx2(auVar22,auVar28);
          auVar115 = vpaddd_avx2(auVar22,auVar115);
          auVar115 = vpaddd_avx2(auVar115,auVar114);
          auVar115 = vpsrad_avx2(auVar115,ZEXT416(uVar11));
          auVar115 = vpaddd_avx2(auVar115,auVar102);
          auVar115 = vpsrad_avx2(auVar115,ZEXT416(uVar2));
          auVar115 = vpackssdw_avx2(auVar115,auVar115);
          auVar115 = vpackuswb_avx2(auVar115,auVar115);
          if (w < 3) {
            vpextrw_avx(auVar115._0_16_,0);
            vpextrw_avx(auVar115._16_16_,0);
          }
          else {
            *(int *)dst = auVar115._0_4_;
            *(int *)(dst + dst_stride) = auVar115._16_4_;
          }
          uVar12 = uVar12 + 2;
          dst = dst + (long)dst_stride * 2;
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + (long)src_stride * 2);
        } while (uVar12 < (uint)h);
      }
    }
    else if (0 < h) {
      puVar7 = src + -1;
      uVar12 = 0;
      do {
        uVar10 = 0;
        do {
          auVar115._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(puVar7 + uVar10) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar7 + (uVar10 - 4));
          auVar115._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar7 + uVar10);
          auVar22 = vpunpcklbw_avx2(auVar115,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar39 = vpunpckhbw_avx2(auVar115,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar115 = vpshufd_avx2(auVar22,0xe6);
          auVar114 = vpshuflw_avx2(auVar115,0x50);
          auVar114 = vpshufhw_avx2(auVar114,0xfa);
          auVar28 = vpunpcklwd_avx2(auVar22,auVar22);
          auVar22 = vpalignr_avx2(auVar115,auVar28,2);
          auVar28 = vpalignr_avx2(auVar114,auVar28,10);
          auVar65 = vpunpcklwd_avx2(auVar39,auVar39);
          auVar115 = vpalignr_avx2(auVar39,auVar114,2);
          auVar114 = vpalignr_avx2(auVar65,auVar114,10);
          auVar39 = vpshufd_avx2(auVar39,0xe6);
          auVar45 = vpshuflw_avx2(auVar39,0x50);
          auVar45 = vpshufd_avx2(auVar45,0xf4);
          auVar39 = vpalignr_avx2(auVar39,auVar65,2);
          auVar45 = vpalignr_avx2(auVar45,auVar65,10);
          auVar115 = vpmaddwd_avx2(auVar111,auVar115);
          auVar114 = vpmaddwd_avx2(auVar114,auVar47);
          auVar115 = vpaddd_avx2(auVar114,auVar115);
          auVar114 = vpmaddwd_avx2(auVar39,auVar70);
          auVar39 = vpmaddwd_avx2(auVar45,auVar83);
          auVar114 = vpaddd_avx2(auVar114,auVar39);
          auVar22 = vpmaddwd_avx2(auVar22,auVar113);
          auVar28 = vpmaddwd_avx2(auVar28,auVar30);
          auVar22 = vpaddd_avx2(auVar22,auVar94);
          auVar22 = vpaddd_avx2(auVar22,auVar28);
          auVar115 = vpaddd_avx2(auVar22,auVar115);
          auVar115 = vpaddd_avx2(auVar115,auVar114);
          auVar115 = vpsrad_avx2(auVar115,ZEXT416(uVar11));
          auVar115 = vpaddd_avx2(auVar102,auVar115);
          auVar115 = vpsrad_avx2(auVar115,auVar26._0_16_);
          auVar115 = vpackssdw_avx2(auVar115,auVar115);
          auVar115 = vpackuswb_avx2(auVar115,auVar115);
          auVar35 = vpunpckldq_avx(auVar115._0_16_,auVar115._16_16_);
          *(long *)(dst + uVar10) = auVar35._0_8_;
          uVar10 = uVar10 + 8;
        } while (uVar10 < (uint)w);
        uVar12 = uVar12 + 1;
        dst = dst + dst_stride;
        puVar7 = puVar7 + src_stride;
        auVar26 = ZEXT1664(auVar26._0_16_);
      } while (uVar12 != (uint)h);
    }
  }
  else {
    cVar9 = '\b';
    if ((piVar1[uVar12 + 7] == 0 && piVar1[uVar12] == 0) &&
       (cVar9 = '\x06', piVar1[uVar12 + 6] == 0 && piVar1[uVar12 + 1] == 0)) {
      cVar9 = (piVar1[uVar12 + 5] != 0 || piVar1[uVar12 + 2] != 0) * '\x02' + '\x02';
    }
    switch(cVar9) {
    case '\x02':
      if (subpel_x_qn == 8) {
        lVar13 = (long)src_stride;
        if (w < 0x10) {
          if (w == 2) {
            do {
              auVar35 = vpunpckldq_avx(ZEXT416(*(uint *)src),ZEXT416(*(uint *)((long)src + lVar13)))
              ;
              auVar19._0_8_ = auVar35._0_8_;
              auVar19._8_8_ = 0;
              auVar35 = vpsrlq_avx(auVar19,8);
              auVar35 = vpavgb_avx(auVar19,auVar35);
              vpextrw_avx(auVar35,0);
              vpextrw_avx(auVar35,2);
              src = (uint8_t *)((long)src + (long)(src_stride * 2));
              h = h + -2;
            } while (h != 0);
            return;
          }
          if (w == 4) {
            do {
              auVar20._8_8_ = 0;
              auVar20._0_8_ = *(ulong *)src;
              auVar35 = vmovhps_avx(auVar20,*(undefined8 *)((long)src + lVar13));
              auVar36 = vpsrlq_avx(auVar35,8);
              auVar35 = vpavgb_avx(auVar35,auVar36);
              *(int *)dst = auVar35._0_4_;
              *(int *)(dst + dst_stride) = auVar35._8_4_;
              src = (uint8_t *)((long)src + (long)(src_stride * 2));
              dst = dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
            return;
          }
          if (w == 8) {
            do {
              auVar35 = vpsrldq_avx(*(undefined1 (*) [16])src,1);
              auVar36 = vpsrldq_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar13),1);
              auVar35 = vpavgb_avx(*(undefined1 (*) [16])src,auVar35);
              auVar36 = vpavgb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar13),
                                   auVar36);
              *(long *)dst = auVar35._0_8_;
              *(long *)(dst + dst_stride) = auVar36._0_8_;
              src = *(undefined1 (*) [16])src + src_stride * 2;
              dst = dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
            return;
          }
        }
        else {
          if (w == 0x10) {
            pauVar6 = (undefined1 (*) [16])(src + 1);
            do {
              auVar35 = vpavgb_avx(*(undefined1 (*) [16])(pauVar6[-1] + 0xf),*pauVar6);
              auVar36 = vpavgb_avx(*(undefined1 (*) [16])(pauVar6[-1] + lVar13 + 0xf),
                                   *(undefined1 (*) [16])(*pauVar6 + lVar13));
              *(undefined1 (*) [16])dst = auVar35;
              *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar36;
              dst = *(undefined1 (*) [16])dst + dst_stride * 2;
              pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
              h = h + -2;
            } while (h != 0);
            return;
          }
          if (w == 0x20) {
            pauVar4 = (undefined1 (*) [32])(src + 1);
            do {
              auVar113 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar4[-1] + 0x1f),*pauVar4);
              *(undefined1 (*) [32])dst = auVar113;
              dst = *(undefined1 (*) [32])dst + dst_stride;
              pauVar4 = (undefined1 (*) [32])(*pauVar4 + lVar13);
              h = h + -1;
            } while (h != 0);
            return;
          }
          if (w == 0x40) {
            pauVar8 = (undefined1 (*) [32])(src + 0x21);
            pauVar4 = (undefined1 (*) [32])(dst + 0x20);
            do {
              auVar113 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
              pauVar4[-1] = auVar113;
              auVar113 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
              *pauVar4 = auVar113;
              pauVar8 = (undefined1 (*) [32])(*pauVar8 + lVar13);
              pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
              h = h + -1;
            } while (h != 0);
            return;
          }
        }
        pauVar8 = (undefined1 (*) [32])(src + 0x61);
        pauVar4 = (undefined1 (*) [32])(dst + 0x60);
        do {
          auVar113 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-4] + 0x1f),pauVar8[-3]);
          pauVar4[-3] = auVar113;
          auVar113 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-3] + 0x1f),pauVar8[-2]);
          pauVar4[-2] = auVar113;
          auVar113 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
          pauVar4[-1] = auVar113;
          auVar113 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
          *pauVar4 = auVar113;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + lVar13);
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
          h = h + -1;
        } while (h != 0);
      }
      else if (w < 9) {
        auVar18 = vpsrlw_avx(ZEXT416(*(uint *)(piVar1 + uVar12 + 3)),1);
        auVar18 = vpshufb_avx(auVar18,_DAT_005177f0);
        lVar13 = (long)src_stride;
        lVar14 = (long)(src_stride * 2);
        if (w == 2) {
          auVar35._8_2_ = 0x22;
          auVar35._0_8_ = 0x22002200220022;
          auVar35._10_2_ = 0x22;
          auVar35._12_2_ = 0x22;
          auVar35._14_2_ = 0x22;
          do {
            auVar36 = vpinsrd_avx(ZEXT416(*(uint *)src),*(undefined4 *)((long)src + lVar13),1);
            auVar36 = vpshufb_avx(auVar36,ZEXT816(0x605050402010100));
            auVar36 = vpmaddubsw_avx(auVar36,auVar18);
            auVar36 = vpaddw_avx(auVar36,auVar35);
            auVar36 = vpsraw_avx(auVar36,6);
            auVar36 = vpackuswb_avx(auVar36,auVar36);
            vpextrw_avx(auVar36,0);
            vpextrw_avx(auVar36,1);
            src = (uint8_t *)((long)src + lVar14);
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 4) {
          auVar37._8_2_ = 0x22;
          auVar37._0_8_ = 0x22002200220022;
          auVar37._10_2_ = 0x22;
          auVar37._12_2_ = 0x22;
          auVar37._14_2_ = 0x22;
          do {
            auVar43._8_8_ = 0;
            auVar43._0_8_ = *(ulong *)src;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *(ulong *)((long)src + lVar13);
            auVar35 = vpunpcklbw_avx(auVar43,auVar54);
            auVar35 = vpshufb_avx(auVar35,auVar36);
            auVar35 = vpmaddubsw_avx(auVar35,auVar18);
            auVar35 = vpaddw_avx(auVar35,auVar37);
            auVar35 = vpsraw_avx(auVar35,6);
            auVar35 = vpackuswb_avx(auVar35,auVar35);
            *(int *)dst = auVar35._0_4_;
            iVar5 = vpextrw_avx(auVar35,3);
            uVar11 = vpextrw_avx(auVar35,2);
            *(uint *)(dst + dst_stride) = uVar11 | iVar5 << 0x10;
            src = (uint8_t *)((long)src + lVar14);
            dst = dst + dst_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
        else {
          auVar36._8_2_ = 0x22;
          auVar36._0_8_ = 0x22002200220022;
          auVar36._10_2_ = 0x22;
          auVar36._12_2_ = 0x22;
          auVar36._14_2_ = 0x22;
          do {
            auVar69 = vpshufb_avx(*(undefined1 (*) [16])src,auVar35);
            auVar55 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar13),auVar35
                                 );
            auVar69 = vpmaddubsw_avx(auVar69,auVar18);
            auVar55 = vpmaddubsw_avx(auVar55,auVar18);
            auVar69 = vpaddw_avx(auVar69,auVar36);
            auVar69 = vpsraw_avx(auVar69,6);
            auVar69 = vpackuswb_avx(auVar69,auVar69);
            auVar55 = vpaddw_avx(auVar55,auVar36);
            auVar55 = vpsraw_avx(auVar55,6);
            auVar55 = vpackuswb_avx(auVar55,auVar55);
            *(long *)dst = auVar69._0_8_;
            *(long *)(dst + dst_stride) = auVar55._0_8_;
            src = *(undefined1 (*) [16])src + lVar14;
            dst = dst + dst_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
      }
      else {
        auVar35 = ZEXT416(*(uint *)(piVar1 + uVar12 + 3));
        auVar24._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar35;
        auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar35;
        auVar113 = vpsrlw_avx2(auVar24,1);
        auVar113 = vpshufb_avx2(auVar113,_DAT_0056c020);
        if (w == 0x10) {
          pauVar6 = (undefined1 (*) [16])(src + 1);
          auVar32._8_2_ = 0x22;
          auVar32._0_8_ = 0x22002200220022;
          auVar32._10_2_ = 0x22;
          auVar32._12_2_ = 0x22;
          auVar32._14_2_ = 0x22;
          auVar32._16_2_ = 0x22;
          auVar32._18_2_ = 0x22;
          auVar32._20_2_ = 0x22;
          auVar32._22_2_ = 0x22;
          auVar32._24_2_ = 0x22;
          auVar32._26_2_ = 0x22;
          auVar32._28_2_ = 0x22;
          auVar32._30_2_ = 0x22;
          do {
            auVar42._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 0xf) +
                 ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + 0xf);
            auVar42._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 0xf);
            auVar53._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
            auVar53._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
            auVar30 = vpunpcklbw_avx2(auVar42,auVar53);
            auVar111 = vpunpckhbw_avx2(auVar42,auVar53);
            auVar30 = vpmaddubsw_avx2(auVar30,auVar113);
            auVar111 = vpmaddubsw_avx2(auVar111,auVar113);
            auVar30 = vpaddw_avx2(auVar30,auVar32);
            auVar47 = vpsraw_avx2(auVar30,6);
            auVar30 = vpaddw_avx2(auVar111,auVar32);
            auVar30 = vpsraw_avx2(auVar30,6);
            auVar30 = vpackuswb_avx2(auVar47,auVar30);
            *(undefined1 (*) [16])dst = auVar30._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar30._16_16_;
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 0x20) {
          pauVar4 = (undefined1 (*) [32])(src + 1);
          auVar31._8_2_ = 0x22;
          auVar31._0_8_ = 0x22002200220022;
          auVar31._10_2_ = 0x22;
          auVar31._12_2_ = 0x22;
          auVar31._14_2_ = 0x22;
          auVar31._16_2_ = 0x22;
          auVar31._18_2_ = 0x22;
          auVar31._20_2_ = 0x22;
          auVar31._22_2_ = 0x22;
          auVar31._24_2_ = 0x22;
          auVar31._26_2_ = 0x22;
          auVar31._28_2_ = 0x22;
          auVar31._30_2_ = 0x22;
          do {
            auVar30 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar4[-1] + 0x1f),*pauVar4);
            auVar111 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar4[-1] + 0x1f),*pauVar4);
            auVar30 = vpmaddubsw_avx2(auVar30,auVar113);
            auVar111 = vpmaddubsw_avx2(auVar111,auVar113);
            auVar30 = vpaddw_avx2(auVar30,auVar31);
            auVar47 = vpsraw_avx2(auVar30,6);
            auVar30 = vpaddw_avx2(auVar111,auVar31);
            auVar30 = vpsraw_avx2(auVar30,6);
            auVar30 = vpackuswb_avx2(auVar47,auVar30);
            *(undefined1 (*) [32])dst = auVar30;
            dst = *(undefined1 (*) [32])dst + dst_stride;
            pauVar4 = (undefined1 (*) [32])(*pauVar4 + src_stride);
            h = h + -1;
          } while (h != 0);
        }
        else if (w == 0x40) {
          pauVar8 = (undefined1 (*) [32])(src + 0x21);
          pauVar4 = (undefined1 (*) [32])(dst + 0x20);
          auVar29._8_2_ = 0x22;
          auVar29._0_8_ = 0x22002200220022;
          auVar29._10_2_ = 0x22;
          auVar29._12_2_ = 0x22;
          auVar29._14_2_ = 0x22;
          auVar29._16_2_ = 0x22;
          auVar29._18_2_ = 0x22;
          auVar29._20_2_ = 0x22;
          auVar29._22_2_ = 0x22;
          auVar29._24_2_ = 0x22;
          auVar29._26_2_ = 0x22;
          auVar29._28_2_ = 0x22;
          auVar29._30_2_ = 0x22;
          do {
            auVar30 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
            auVar111 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
            auVar30 = vpmaddubsw_avx2(auVar30,auVar113);
            auVar111 = vpmaddubsw_avx2(auVar111,auVar113);
            auVar30 = vpaddw_avx2(auVar30,auVar29);
            auVar47 = vpsraw_avx2(auVar30,6);
            auVar30 = vpaddw_avx2(auVar111,auVar29);
            auVar30 = vpsraw_avx2(auVar30,6);
            auVar30 = vpackuswb_avx2(auVar47,auVar30);
            pauVar4[-1] = auVar30;
            auVar30 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
            auVar111 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
            auVar30 = vpmaddubsw_avx2(auVar30,auVar113);
            auVar111 = vpmaddubsw_avx2(auVar111,auVar113);
            auVar30 = vpaddw_avx2(auVar30,auVar29);
            auVar47 = vpsraw_avx2(auVar30,6);
            auVar30 = vpaddw_avx2(auVar111,auVar29);
            auVar30 = vpsraw_avx2(auVar30,6);
            auVar30 = vpackuswb_avx2(auVar47,auVar30);
            *pauVar4 = auVar30;
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
            pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
            h = h + -1;
          } while (h != 0);
        }
        else {
          pauVar8 = (undefined1 (*) [32])(src + 0x61);
          pauVar4 = (undefined1 (*) [32])(dst + 0x60);
          auVar33._8_2_ = 0x22;
          auVar33._0_8_ = 0x22002200220022;
          auVar33._10_2_ = 0x22;
          auVar33._12_2_ = 0x22;
          auVar33._14_2_ = 0x22;
          auVar33._16_2_ = 0x22;
          auVar33._18_2_ = 0x22;
          auVar33._20_2_ = 0x22;
          auVar33._22_2_ = 0x22;
          auVar33._24_2_ = 0x22;
          auVar33._26_2_ = 0x22;
          auVar33._28_2_ = 0x22;
          auVar33._30_2_ = 0x22;
          do {
            auVar30 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-4] + 0x1f),pauVar8[-3]);
            auVar111 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-4] + 0x1f),pauVar8[-3]);
            auVar30 = vpmaddubsw_avx2(auVar30,auVar113);
            auVar111 = vpmaddubsw_avx2(auVar111,auVar113);
            auVar30 = vpaddw_avx2(auVar30,auVar33);
            auVar47 = vpsraw_avx2(auVar30,6);
            auVar30 = vpaddw_avx2(auVar111,auVar33);
            auVar30 = vpsraw_avx2(auVar30,6);
            auVar30 = vpackuswb_avx2(auVar47,auVar30);
            pauVar4[-3] = auVar30;
            auVar30 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-3] + 0x1f),pauVar8[-2]);
            auVar111 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-3] + 0x1f),pauVar8[-2]);
            auVar30 = vpmaddubsw_avx2(auVar30,auVar113);
            auVar111 = vpmaddubsw_avx2(auVar111,auVar113);
            auVar30 = vpaddw_avx2(auVar30,auVar33);
            auVar47 = vpsraw_avx2(auVar30,6);
            auVar30 = vpaddw_avx2(auVar111,auVar33);
            auVar30 = vpsraw_avx2(auVar30,6);
            auVar30 = vpackuswb_avx2(auVar47,auVar30);
            pauVar4[-2] = auVar30;
            auVar30 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
            auVar111 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
            auVar30 = vpmaddubsw_avx2(auVar30,auVar113);
            auVar111 = vpmaddubsw_avx2(auVar111,auVar113);
            auVar30 = vpaddw_avx2(auVar30,auVar33);
            auVar47 = vpsraw_avx2(auVar30,6);
            auVar30 = vpaddw_avx2(auVar111,auVar33);
            auVar30 = vpsraw_avx2(auVar30,6);
            auVar30 = vpackuswb_avx2(auVar47,auVar30);
            pauVar4[-1] = auVar30;
            auVar30 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
            auVar111 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
            auVar30 = vpmaddubsw_avx2(auVar30,auVar113);
            auVar111 = vpmaddubsw_avx2(auVar111,auVar113);
            auVar30 = vpaddw_avx2(auVar30,auVar33);
            auVar47 = vpsraw_avx2(auVar30,6);
            auVar30 = vpaddw_avx2(auVar111,auVar33);
            auVar30 = vpsraw_avx2(auVar30,6);
            auVar30 = vpackuswb_avx2(auVar47,auVar30);
            *pauVar4 = auVar30;
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
            pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
            h = h + -1;
          } while (h != 0);
        }
      }
      break;
    case '\x04':
      auVar36 = vpsraw_avx(*(undefined1 (*) [16])(piVar1 + uVar12),1);
      auVar35 = vpshufb_avx(auVar36,_DAT_00517840);
      pauVar6 = (undefined1 (*) [16])(src + -1);
      auVar36 = vpshufb_avx(auVar36,_DAT_00517810);
      if (w == 2) {
        auVar18._8_2_ = 0x22;
        auVar18._0_8_ = 0x22002200220022;
        auVar18._10_2_ = 0x22;
        auVar18._12_2_ = 0x22;
        auVar18._14_2_ = 0x22;
        do {
          auVar69._8_8_ = 0;
          auVar69._0_8_ = *(ulong *)*pauVar6;
          auVar69 = vmovhps_avx(auVar69,*(undefined8 *)(*pauVar6 + src_stride));
          auVar55 = vpshufb_avx(auVar69,ZEXT816(0xa09090802010100));
          auVar68 = vpshufb_avx(auVar69,ZEXT816(0xc0b0b0a04030302));
          auVar69 = vpmaddubsw_avx(auVar55,auVar35);
          auVar55 = vpmaddubsw_avx(auVar68,auVar36);
          auVar69 = vpaddw_avx(auVar69,auVar55);
          auVar69 = vpaddw_avx(auVar69,auVar18);
          auVar69 = vpsraw_avx(auVar69,6);
          auVar69 = vpackuswb_avx(auVar69,auVar69);
          vpextrw_avx(auVar69,0);
          vpextrw_avx(auVar69,1);
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
          h = h + -2;
        } while (h != 0);
      }
      else if (w == 8) {
        if (0 < h) {
          auVar23._16_16_ = *(undefined1 (*) [16])(piVar1 + uVar12);
          auVar23._0_16_ = *(undefined1 (*) [16])(piVar1 + uVar12);
          auVar30 = vpsraw_avx2(auVar23,1);
          auVar113 = vpshufb_avx2(auVar30,_DAT_0056c040);
          auVar30 = vpshufb_avx2(auVar30,_DAT_0056c060);
          uVar12 = 0;
          auVar40._16_16_ = _DAT_00517c80;
          auVar40._0_16_ = _DAT_00517c80;
          auVar46._16_16_ = _DAT_00517860;
          auVar46._0_16_ = _DAT_00517860;
          auVar58._8_2_ = 0x22;
          auVar58._0_8_ = 0x22002200220022;
          auVar58._10_2_ = 0x22;
          auVar58._12_2_ = 0x22;
          auVar58._14_2_ = 0x22;
          auVar58._16_2_ = 0x22;
          auVar58._18_2_ = 0x22;
          auVar58._20_2_ = 0x22;
          auVar58._22_2_ = 0x22;
          auVar58._24_2_ = 0x22;
          auVar58._26_2_ = 0x22;
          auVar58._28_2_ = 0x22;
          auVar58._30_2_ = 0x22;
          do {
            auVar73._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
            auVar73._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
            auVar111 = vpshufb_avx2(auVar73,auVar40);
            auVar111 = vpmaddubsw_avx2(auVar111,auVar113);
            auVar47 = vpshufb_avx2(auVar73,auVar46);
            auVar47 = vpmaddubsw_avx2(auVar47,auVar30);
            auVar111 = vpaddw_avx2(auVar111,auVar47);
            auVar111 = vpaddw_avx2(auVar111,auVar58);
            auVar111 = vpsraw_avx2(auVar111,6);
            auVar111 = vpackuswb_avx2(auVar111,auVar113);
            *(long *)dst = auVar111._0_8_;
            *(long *)(dst + dst_stride) = auVar111._16_8_;
            uVar12 = uVar12 + 2;
            pauVar6 = (undefined1 (*) [16])(*pauVar6 + (long)src_stride * 2);
            dst = dst + (long)dst_stride * 2;
          } while (uVar12 < (uint)h);
        }
      }
      else if (w == 4) {
        auVar55._8_2_ = 0x22;
        auVar55._0_8_ = 0x22002200220022;
        auVar55._10_2_ = 0x22;
        auVar55._12_2_ = 0x22;
        auVar55._14_2_ = 0x22;
        do {
          auVar68._8_8_ = 0;
          auVar68._0_8_ = *(ulong *)*pauVar6;
          auVar68 = vmovhps_avx(auVar68,*(undefined8 *)(*pauVar6 + src_stride));
          auVar37 = vpshufb_avx(auVar68,auVar18);
          auVar43 = vpshufb_avx(auVar68,auVar69);
          auVar68 = vpmaddubsw_avx(auVar37,auVar35);
          auVar37 = vpmaddubsw_avx(auVar43,auVar36);
          auVar68 = vpaddw_avx(auVar68,auVar37);
          auVar68 = vpaddw_avx(auVar68,auVar55);
          auVar68 = vpsraw_avx(auVar68,6);
          auVar68 = vpackuswb_avx(auVar68,auVar68);
          *(int *)dst = auVar68._0_4_;
          iVar5 = vpextrw_avx(auVar68,3);
          uVar11 = vpextrw_avx(auVar68,2);
          *(uint *)(dst + dst_stride) = uVar11 | iVar5 << 0x10;
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
          dst = dst + dst_stride * 2;
          h = h + -2;
        } while (h != 0);
      }
      else if (0 < h) {
        auVar25._16_16_ = *(undefined1 (*) [16])(piVar1 + uVar12);
        auVar25._0_16_ = *(undefined1 (*) [16])(piVar1 + uVar12);
        auVar30 = vpsraw_avx2(auVar25,1);
        auVar113 = vpshufb_avx2(auVar30,_DAT_0056c040);
        auVar30 = vpshufb_avx2(auVar30,_DAT_0056c060);
        lVar13 = 0x800000000;
        uVar12 = 0;
        auVar41._16_16_ = _DAT_00517c80;
        auVar41._0_16_ = _DAT_00517c80;
        auVar48._16_16_ = _DAT_00517860;
        auVar48._0_16_ = _DAT_00517860;
        auVar59._8_2_ = 0x22;
        auVar59._0_8_ = 0x22002200220022;
        auVar59._10_2_ = 0x22;
        auVar59._12_2_ = 0x22;
        auVar59._14_2_ = 0x22;
        auVar59._16_2_ = 0x22;
        auVar59._18_2_ = 0x22;
        auVar59._20_2_ = 0x22;
        auVar59._22_2_ = 0x22;
        auVar59._24_2_ = 0x22;
        auVar59._26_2_ = 0x22;
        auVar59._28_2_ = 0x22;
        auVar59._30_2_ = 0x22;
        pauVar17 = pauVar6;
        do {
          if (0 < w) {
            lVar15 = 0;
            lVar14 = lVar13;
            do {
              auVar74._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + (lVar14 >> 0x20)) +
                   ZEXT116(1) * SUB3216(*(undefined1 (*) [32])(*pauVar17 + lVar15),0);
              auVar74._16_16_ =
                   ZEXT116(0) * SUB3216(*(undefined1 (*) [32])(*pauVar17 + lVar15),0x10) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + (lVar14 >> 0x20));
              auVar111 = vpshufb_avx2(auVar74,auVar41);
              auVar111 = vpmaddubsw_avx2(auVar111,auVar113);
              auVar47 = vpshufb_avx2(auVar74,auVar48);
              auVar47 = vpmaddubsw_avx2(auVar47,auVar30);
              auVar111 = vpaddw_avx2(auVar111,auVar47);
              auVar111 = vpaddw_avx2(auVar111,auVar59);
              auVar111 = vpsraw_avx2(auVar111,6);
              auVar35 = vpackuswb_avx(auVar111._0_16_,auVar111._16_16_);
              *(undefined1 (*) [16])(dst + lVar15) = auVar35;
              lVar15 = lVar15 + 0x10;
              lVar14 = lVar14 + 0x1000000000;
            } while (lVar15 < w);
          }
          uVar12 = uVar12 + 1;
          dst = dst + dst_stride;
          pauVar17 = (undefined1 (*) [16])(*pauVar17 + src_stride);
          lVar13 = lVar13 + ((long)src_stride << 0x20);
        } while (uVar12 != (uint)h);
      }
      break;
    case '\x06':
      auVar36 = vpsraw_avx(*(undefined1 (*) [16])(piVar1 + uVar12),1);
      auVar35 = vpshufb_avx(auVar36,_DAT_0056c160);
      auVar21._0_2_ = auVar35._0_2_;
      auVar21._2_2_ = auVar21._0_2_;
      auVar21._4_2_ = auVar21._0_2_;
      auVar21._6_2_ = auVar21._0_2_;
      auVar21._8_2_ = auVar21._0_2_;
      auVar21._10_2_ = auVar21._0_2_;
      auVar21._12_2_ = auVar21._0_2_;
      auVar21._14_2_ = auVar21._0_2_;
      auVar21._16_2_ = auVar21._0_2_;
      auVar21._18_2_ = auVar21._0_2_;
      auVar21._20_2_ = auVar21._0_2_;
      auVar21._22_2_ = auVar21._0_2_;
      auVar21._24_2_ = auVar21._0_2_;
      auVar21._26_2_ = auVar21._0_2_;
      auVar21._28_2_ = auVar21._0_2_;
      auVar21._30_2_ = auVar21._0_2_;
      auVar35 = vpshufb_avx(auVar36,_DAT_0056c170);
      auVar36 = vpshufb_avx(auVar36,_DAT_0056c180);
      uVar34 = auVar35._0_2_;
      auVar27._2_2_ = uVar34;
      auVar27._0_2_ = uVar34;
      auVar27._4_2_ = uVar34;
      auVar27._6_2_ = uVar34;
      auVar27._8_2_ = uVar34;
      auVar27._10_2_ = uVar34;
      auVar27._12_2_ = uVar34;
      auVar27._14_2_ = uVar34;
      auVar27._16_2_ = uVar34;
      auVar27._18_2_ = uVar34;
      auVar27._20_2_ = uVar34;
      auVar27._22_2_ = uVar34;
      auVar27._24_2_ = uVar34;
      auVar27._26_2_ = uVar34;
      auVar27._28_2_ = uVar34;
      auVar27._30_2_ = uVar34;
      uVar34 = auVar36._0_2_;
      auVar38._2_2_ = uVar34;
      auVar38._0_2_ = uVar34;
      auVar38._4_2_ = uVar34;
      auVar38._6_2_ = uVar34;
      auVar38._8_2_ = uVar34;
      auVar38._10_2_ = uVar34;
      auVar38._12_2_ = uVar34;
      auVar38._14_2_ = uVar34;
      auVar38._16_2_ = uVar34;
      auVar38._18_2_ = uVar34;
      auVar38._20_2_ = uVar34;
      auVar38._22_2_ = uVar34;
      auVar38._24_2_ = uVar34;
      auVar38._26_2_ = uVar34;
      auVar38._28_2_ = uVar34;
      auVar38._30_2_ = uVar34;
      switch(w << 0x1d | w - 8U >> 3) {
      case 0:
        pauVar6 = (undefined1 (*) [16])(src + -2);
        auVar44._16_16_ = _DAT_00517c80;
        auVar44._0_16_ = _DAT_00517c80;
        auVar56._16_16_ = _DAT_00517860;
        auVar56._0_16_ = _DAT_00517860;
        auVar71._16_16_ = _DAT_00517870;
        auVar71._0_16_ = _DAT_00517870;
        auVar84._8_2_ = 0x22;
        auVar84._0_8_ = 0x22002200220022;
        auVar84._10_2_ = 0x22;
        auVar84._12_2_ = 0x22;
        auVar84._14_2_ = 0x22;
        auVar84._16_2_ = 0x22;
        auVar84._18_2_ = 0x22;
        auVar84._20_2_ = 0x22;
        auVar84._22_2_ = 0x22;
        auVar84._24_2_ = 0x22;
        auVar84._26_2_ = 0x22;
        auVar84._28_2_ = 0x22;
        auVar84._30_2_ = 0x22;
        do {
          auVar95._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
          auVar95._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
          auVar113 = vpshufb_avx2(auVar95,auVar44);
          auVar30 = vpshufb_avx2(auVar95,auVar56);
          auVar111 = vpshufb_avx2(auVar95,auVar71);
          auVar113 = vpmaddubsw_avx2(auVar113,auVar21);
          auVar30 = vpmaddubsw_avx2(auVar30,auVar27);
          auVar113 = vpaddw_avx2(auVar113,auVar30);
          auVar30 = vpmaddubsw_avx2(auVar111,auVar38);
          auVar30 = vpaddw_avx2(auVar30,auVar84);
          auVar113 = vpaddw_avx2(auVar113,auVar30);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar113,auVar21);
          *(long *)dst = auVar113._0_8_;
          *(long *)(dst + dst_stride) = auVar113._16_8_;
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
          dst = dst + dst_stride * 2;
          h = h + -2;
        } while (h != 0);
        break;
      case 1:
        pauVar6 = (undefined1 (*) [16])(src + 6);
        auVar50._16_16_ = _DAT_00517c80;
        auVar50._0_16_ = _DAT_00517c80;
        auVar61._16_16_ = _DAT_00517860;
        auVar61._0_16_ = _DAT_00517860;
        auVar76._16_16_ = _DAT_00517870;
        auVar76._0_16_ = _DAT_00517870;
        auVar87._8_2_ = 0x22;
        auVar87._0_8_ = 0x22002200220022;
        auVar87._10_2_ = 0x22;
        auVar87._12_2_ = 0x22;
        auVar87._14_2_ = 0x22;
        auVar87._16_2_ = 0x22;
        auVar87._18_2_ = 0x22;
        auVar87._20_2_ = 0x22;
        auVar87._22_2_ = 0x22;
        auVar87._24_2_ = 0x22;
        auVar87._26_2_ = 0x22;
        auVar87._28_2_ = 0x22;
        auVar87._30_2_ = 0x22;
        do {
          auVar97._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 8) +
               ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + 8);
          auVar97._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 8);
          auVar113 = vpshufb_avx2(auVar97,auVar50);
          auVar30 = vpshufb_avx2(auVar97,auVar61);
          auVar111 = vpshufb_avx2(auVar97,auVar76);
          auVar113 = vpmaddubsw_avx2(auVar113,auVar21);
          auVar30 = vpmaddubsw_avx2(auVar30,auVar27);
          auVar113 = vpaddw_avx2(auVar113,auVar30);
          auVar104._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
          auVar104._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
          auVar111 = vpmaddubsw_avx2(auVar111,auVar38);
          auVar30 = vpshufb_avx2(auVar104,auVar50);
          auVar47 = vpshufb_avx2(auVar104,auVar61);
          auVar70 = vpshufb_avx2(auVar104,auVar76);
          auVar30 = vpmaddubsw_avx2(auVar30,auVar21);
          auVar47 = vpmaddubsw_avx2(auVar47,auVar27);
          auVar30 = vpaddw_avx2(auVar30,auVar47);
          auVar47 = vpmaddubsw_avx2(auVar70,auVar38);
          auVar111 = vpaddw_avx2(auVar111,auVar87);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar47,auVar87);
          auVar113 = vpaddw_avx2(auVar30,auVar113);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          *(undefined1 (*) [16])dst = auVar113._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar113._16_16_;
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
          h = h + -2;
        } while (h != 0);
        break;
      default:
        pauVar8 = (undefined1 (*) [32])(src + 0x66);
        pauVar4 = (undefined1 (*) [32])(dst + 0x60);
        auVar52._16_16_ = _DAT_00517c80;
        auVar52._0_16_ = _DAT_00517c80;
        auVar66._16_16_ = _DAT_00517860;
        auVar66._0_16_ = _DAT_00517860;
        auVar81._16_16_ = _DAT_00517870;
        auVar81._0_16_ = _DAT_00517870;
        auVar92._8_2_ = 0x22;
        auVar92._0_8_ = 0x22002200220022;
        auVar92._10_2_ = 0x22;
        auVar92._12_2_ = 0x22;
        auVar92._14_2_ = 0x22;
        auVar92._16_2_ = 0x22;
        auVar92._18_2_ = 0x22;
        auVar92._20_2_ = 0x22;
        auVar92._22_2_ = 0x22;
        auVar92._24_2_ = 0x22;
        auVar92._26_2_ = 0x22;
        auVar92._28_2_ = 0x22;
        auVar92._30_2_ = 0x22;
        do {
          auVar113 = *(undefined1 (*) [32])(pauVar8[-4] + 0x18);
          auVar30 = pauVar8[-3];
          auVar111 = vpshufb_avx2(auVar113,auVar52);
          auVar47 = vpshufb_avx2(auVar113,auVar66);
          auVar70 = vpshufb_avx2(auVar113,auVar81);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar21);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar27);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar38);
          auVar47 = vpshufb_avx2(auVar30,auVar52);
          auVar70 = vpshufb_avx2(auVar30,auVar66);
          auVar83 = vpshufb_avx2(auVar30,auVar81);
          auVar30 = vpmaddubsw_avx2(auVar47,auVar21);
          auVar47 = vpmaddubsw_avx2(auVar70,auVar27);
          auVar30 = vpaddw_avx2(auVar30,auVar47);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar38);
          auVar111 = vpaddw_avx2(auVar111,auVar92);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar47,auVar92);
          auVar113 = vpaddw_avx2(auVar30,auVar113);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          pauVar4[-3] = auVar113;
          auVar113 = *(undefined1 (*) [32])(pauVar8[-3] + 0x18);
          auVar30 = pauVar8[-2];
          auVar111 = vpshufb_avx2(auVar113,auVar52);
          auVar47 = vpshufb_avx2(auVar113,auVar66);
          auVar70 = vpshufb_avx2(auVar113,auVar81);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar21);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar27);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar38);
          auVar47 = vpshufb_avx2(auVar30,auVar52);
          auVar70 = vpshufb_avx2(auVar30,auVar66);
          auVar83 = vpshufb_avx2(auVar30,auVar81);
          auVar30 = vpmaddubsw_avx2(auVar47,auVar21);
          auVar47 = vpmaddubsw_avx2(auVar70,auVar27);
          auVar30 = vpaddw_avx2(auVar30,auVar47);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar38);
          auVar111 = vpaddw_avx2(auVar111,auVar92);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar47,auVar92);
          auVar113 = vpaddw_avx2(auVar30,auVar113);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          pauVar4[-2] = auVar113;
          auVar113 = *(undefined1 (*) [32])(pauVar8[-2] + 0x18);
          auVar30 = pauVar8[-1];
          auVar111 = vpshufb_avx2(auVar113,auVar52);
          auVar47 = vpshufb_avx2(auVar113,auVar66);
          auVar70 = vpshufb_avx2(auVar113,auVar81);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar21);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar27);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar38);
          auVar47 = vpshufb_avx2(auVar30,auVar52);
          auVar70 = vpshufb_avx2(auVar30,auVar66);
          auVar83 = vpshufb_avx2(auVar30,auVar81);
          auVar30 = vpmaddubsw_avx2(auVar47,auVar21);
          auVar47 = vpmaddubsw_avx2(auVar70,auVar27);
          auVar30 = vpaddw_avx2(auVar30,auVar47);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar38);
          auVar111 = vpaddw_avx2(auVar111,auVar92);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar47,auVar92);
          auVar113 = vpaddw_avx2(auVar30,auVar113);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          pauVar4[-1] = auVar113;
          auVar113 = *(undefined1 (*) [32])(pauVar8[-1] + 0x18);
          auVar30 = *pauVar8;
          auVar111 = vpshufb_avx2(auVar113,auVar52);
          auVar47 = vpshufb_avx2(auVar113,auVar66);
          auVar70 = vpshufb_avx2(auVar113,auVar81);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar21);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar27);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar38);
          auVar47 = vpshufb_avx2(auVar30,auVar52);
          auVar70 = vpshufb_avx2(auVar30,auVar66);
          auVar83 = vpshufb_avx2(auVar30,auVar81);
          auVar30 = vpmaddubsw_avx2(auVar47,auVar21);
          auVar47 = vpmaddubsw_avx2(auVar70,auVar27);
          auVar30 = vpaddw_avx2(auVar30,auVar47);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar38);
          auVar111 = vpaddw_avx2(auVar111,auVar92);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar47,auVar92);
          auVar113 = vpaddw_avx2(auVar30,auVar113);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          *pauVar4 = auVar113;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
          h = h + -1;
        } while (h != 0);
        break;
      case 3:
        pauVar4 = (undefined1 (*) [32])(src + 6);
        auVar49._16_16_ = _DAT_00517c80;
        auVar49._0_16_ = _DAT_00517c80;
        auVar60._16_16_ = _DAT_00517860;
        auVar60._0_16_ = _DAT_00517860;
        auVar75._16_16_ = _DAT_00517870;
        auVar75._0_16_ = _DAT_00517870;
        auVar86._8_2_ = 0x22;
        auVar86._0_8_ = 0x22002200220022;
        auVar86._10_2_ = 0x22;
        auVar86._12_2_ = 0x22;
        auVar86._14_2_ = 0x22;
        auVar86._16_2_ = 0x22;
        auVar86._18_2_ = 0x22;
        auVar86._20_2_ = 0x22;
        auVar86._22_2_ = 0x22;
        auVar86._24_2_ = 0x22;
        auVar86._26_2_ = 0x22;
        auVar86._28_2_ = 0x22;
        auVar86._30_2_ = 0x22;
        do {
          auVar113 = *(undefined1 (*) [32])(pauVar4[-1] + 0x18);
          auVar30 = *pauVar4;
          auVar111 = vpshufb_avx2(auVar113,auVar49);
          auVar47 = vpshufb_avx2(auVar113,auVar60);
          auVar70 = vpshufb_avx2(auVar113,auVar75);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar21);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar27);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar38);
          auVar47 = vpshufb_avx2(auVar30,auVar49);
          auVar70 = vpshufb_avx2(auVar30,auVar60);
          auVar83 = vpshufb_avx2(auVar30,auVar75);
          auVar30 = vpmaddubsw_avx2(auVar47,auVar21);
          auVar47 = vpmaddubsw_avx2(auVar70,auVar27);
          auVar30 = vpaddw_avx2(auVar30,auVar47);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar38);
          auVar111 = vpaddw_avx2(auVar111,auVar86);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar47,auVar86);
          auVar113 = vpaddw_avx2(auVar30,auVar113);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          *(undefined1 (*) [32])dst = auVar113;
          dst = *(undefined1 (*) [32])dst + dst_stride;
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + src_stride);
          h = h + -1;
        } while (h != 0);
        break;
      case 7:
        pauVar8 = (undefined1 (*) [32])(src + 0x26);
        pauVar4 = (undefined1 (*) [32])(dst + 0x20);
        auVar51._16_16_ = _DAT_00517c80;
        auVar51._0_16_ = _DAT_00517c80;
        auVar62._16_16_ = _DAT_00517860;
        auVar62._0_16_ = _DAT_00517860;
        auVar77._16_16_ = _DAT_00517870;
        auVar77._0_16_ = _DAT_00517870;
        auVar88._8_2_ = 0x22;
        auVar88._0_8_ = 0x22002200220022;
        auVar88._10_2_ = 0x22;
        auVar88._12_2_ = 0x22;
        auVar88._14_2_ = 0x22;
        auVar88._16_2_ = 0x22;
        auVar88._18_2_ = 0x22;
        auVar88._20_2_ = 0x22;
        auVar88._22_2_ = 0x22;
        auVar88._24_2_ = 0x22;
        auVar88._26_2_ = 0x22;
        auVar88._28_2_ = 0x22;
        auVar88._30_2_ = 0x22;
        do {
          auVar113 = *(undefined1 (*) [32])(pauVar8[-2] + 0x18);
          auVar30 = pauVar8[-1];
          auVar111 = vpshufb_avx2(auVar113,auVar51);
          auVar47 = vpshufb_avx2(auVar113,auVar62);
          auVar70 = vpshufb_avx2(auVar113,auVar77);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar21);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar27);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar38);
          auVar47 = vpshufb_avx2(auVar30,auVar51);
          auVar70 = vpshufb_avx2(auVar30,auVar62);
          auVar83 = vpshufb_avx2(auVar30,auVar77);
          auVar30 = vpmaddubsw_avx2(auVar47,auVar21);
          auVar47 = vpmaddubsw_avx2(auVar70,auVar27);
          auVar30 = vpaddw_avx2(auVar30,auVar47);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar38);
          auVar111 = vpaddw_avx2(auVar111,auVar88);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar47,auVar88);
          auVar113 = vpaddw_avx2(auVar30,auVar113);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          pauVar4[-1] = auVar113;
          auVar113 = *(undefined1 (*) [32])(pauVar8[-1] + 0x18);
          auVar30 = *pauVar8;
          auVar111 = vpshufb_avx2(auVar113,auVar51);
          auVar47 = vpshufb_avx2(auVar113,auVar62);
          auVar70 = vpshufb_avx2(auVar113,auVar77);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar21);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar27);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar38);
          auVar47 = vpshufb_avx2(auVar30,auVar51);
          auVar70 = vpshufb_avx2(auVar30,auVar62);
          auVar83 = vpshufb_avx2(auVar30,auVar77);
          auVar30 = vpmaddubsw_avx2(auVar47,auVar21);
          auVar47 = vpmaddubsw_avx2(auVar70,auVar27);
          auVar30 = vpaddw_avx2(auVar30,auVar47);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar38);
          auVar111 = vpaddw_avx2(auVar111,auVar88);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar47,auVar88);
          auVar113 = vpaddw_avx2(auVar30,auVar113);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          *pauVar4 = auVar113;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
          h = h + -1;
        } while (h != 0);
      }
      break;
    case '\b':
      auVar36 = vpsraw_avx(*(undefined1 (*) [16])(piVar1 + uVar12),1);
      auVar35 = vpshufb_avx(auVar36,_DAT_0056c1a0);
      auVar22._0_2_ = auVar35._0_2_;
      auVar22._2_2_ = auVar22._0_2_;
      auVar22._4_2_ = auVar22._0_2_;
      auVar22._6_2_ = auVar22._0_2_;
      auVar22._8_2_ = auVar22._0_2_;
      auVar22._10_2_ = auVar22._0_2_;
      auVar22._12_2_ = auVar22._0_2_;
      auVar22._14_2_ = auVar22._0_2_;
      auVar22._16_2_ = auVar22._0_2_;
      auVar22._18_2_ = auVar22._0_2_;
      auVar22._20_2_ = auVar22._0_2_;
      auVar22._22_2_ = auVar22._0_2_;
      auVar22._24_2_ = auVar22._0_2_;
      auVar22._26_2_ = auVar22._0_2_;
      auVar22._28_2_ = auVar22._0_2_;
      auVar22._30_2_ = auVar22._0_2_;
      auVar35 = vpshufb_avx(auVar36,_DAT_0056c100);
      auVar28._0_2_ = auVar35._0_2_;
      auVar28._2_2_ = auVar28._0_2_;
      auVar28._4_2_ = auVar28._0_2_;
      auVar28._6_2_ = auVar28._0_2_;
      auVar28._8_2_ = auVar28._0_2_;
      auVar28._10_2_ = auVar28._0_2_;
      auVar28._12_2_ = auVar28._0_2_;
      auVar28._14_2_ = auVar28._0_2_;
      auVar28._16_2_ = auVar28._0_2_;
      auVar28._18_2_ = auVar28._0_2_;
      auVar28._20_2_ = auVar28._0_2_;
      auVar28._22_2_ = auVar28._0_2_;
      auVar28._24_2_ = auVar28._0_2_;
      auVar28._26_2_ = auVar28._0_2_;
      auVar28._28_2_ = auVar28._0_2_;
      auVar28._30_2_ = auVar28._0_2_;
      auVar35 = vpshufb_avx(auVar36,_DAT_0056c110);
      auVar36 = vpshufb_avx(auVar36,_DAT_0056c1b0);
      uVar34 = auVar35._0_2_;
      auVar39._2_2_ = uVar34;
      auVar39._0_2_ = uVar34;
      auVar39._4_2_ = uVar34;
      auVar39._6_2_ = uVar34;
      auVar39._8_2_ = uVar34;
      auVar39._10_2_ = uVar34;
      auVar39._12_2_ = uVar34;
      auVar39._14_2_ = uVar34;
      auVar39._16_2_ = uVar34;
      auVar39._18_2_ = uVar34;
      auVar39._20_2_ = uVar34;
      auVar39._22_2_ = uVar34;
      auVar39._24_2_ = uVar34;
      auVar39._26_2_ = uVar34;
      auVar39._28_2_ = uVar34;
      auVar39._30_2_ = uVar34;
      uVar34 = auVar36._0_2_;
      auVar45._2_2_ = uVar34;
      auVar45._0_2_ = uVar34;
      auVar45._4_2_ = uVar34;
      auVar45._6_2_ = uVar34;
      auVar45._8_2_ = uVar34;
      auVar45._10_2_ = uVar34;
      auVar45._12_2_ = uVar34;
      auVar45._14_2_ = uVar34;
      auVar45._16_2_ = uVar34;
      auVar45._18_2_ = uVar34;
      auVar45._20_2_ = uVar34;
      auVar45._22_2_ = uVar34;
      auVar45._24_2_ = uVar34;
      auVar45._26_2_ = uVar34;
      auVar45._28_2_ = uVar34;
      auVar45._30_2_ = uVar34;
      switch(w << 0x1d | w - 8U >> 3) {
      case 0:
        pauVar6 = (undefined1 (*) [16])(src + -3);
        auVar57._16_16_ = _DAT_00517c80;
        auVar57._0_16_ = _DAT_00517c80;
        auVar72._16_16_ = _DAT_00517860;
        auVar72._0_16_ = _DAT_00517860;
        auVar85._16_16_ = _DAT_00517870;
        auVar85._0_16_ = _DAT_00517870;
        auVar96._16_16_ = _DAT_005186b0;
        auVar96._0_16_ = _DAT_005186b0;
        auVar103._8_2_ = 0x22;
        auVar103._0_8_ = 0x22002200220022;
        auVar103._10_2_ = 0x22;
        auVar103._12_2_ = 0x22;
        auVar103._14_2_ = 0x22;
        auVar103._16_2_ = 0x22;
        auVar103._18_2_ = 0x22;
        auVar103._20_2_ = 0x22;
        auVar103._22_2_ = 0x22;
        auVar103._24_2_ = 0x22;
        auVar103._26_2_ = 0x22;
        auVar103._28_2_ = 0x22;
        auVar103._30_2_ = 0x22;
        do {
          auVar109._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
          auVar109._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
          auVar113 = vpshufb_avx2(auVar109,auVar57);
          auVar30 = vpshufb_avx2(auVar109,auVar72);
          auVar111 = vpshufb_avx2(auVar109,auVar85);
          auVar47 = vpshufb_avx2(auVar109,auVar96);
          auVar113 = vpmaddubsw_avx2(auVar113,auVar22);
          auVar30 = vpmaddubsw_avx2(auVar30,auVar28);
          auVar113 = vpaddw_avx2(auVar113,auVar30);
          auVar30 = vpmaddubsw_avx2(auVar111,auVar39);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar45);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar113 = vpaddw_avx2(auVar113,auVar30);
          auVar113 = vpaddw_avx2(auVar113,auVar103);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar113,auVar22);
          *(long *)dst = auVar113._0_8_;
          *(long *)(dst + dst_stride) = auVar113._16_8_;
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
          dst = dst + dst_stride * 2;
          h = h + -2;
        } while (h != 0);
        break;
      case 1:
        pauVar6 = (undefined1 (*) [16])(src + 5);
        auVar64._16_16_ = _DAT_00517c80;
        auVar64._0_16_ = _DAT_00517c80;
        auVar79._16_16_ = _DAT_00517860;
        auVar79._0_16_ = _DAT_00517860;
        auVar90._16_16_ = _DAT_00517870;
        auVar90._0_16_ = _DAT_00517870;
        auVar99._16_16_ = _DAT_005186b0;
        auVar99._0_16_ = _DAT_005186b0;
        auVar106._8_2_ = 0x22;
        auVar106._0_8_ = 0x22002200220022;
        auVar106._10_2_ = 0x22;
        auVar106._12_2_ = 0x22;
        auVar106._14_2_ = 0x22;
        auVar106._16_2_ = 0x22;
        auVar106._18_2_ = 0x22;
        auVar106._20_2_ = 0x22;
        auVar106._22_2_ = 0x22;
        auVar106._24_2_ = 0x22;
        auVar106._26_2_ = 0x22;
        auVar106._28_2_ = 0x22;
        auVar106._30_2_ = 0x22;
        do {
          auVar110._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 8) +
               ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + 8);
          auVar110._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 8);
          auVar113 = vpshufb_avx2(auVar110,auVar64);
          auVar30 = vpshufb_avx2(auVar110,auVar79);
          auVar111 = vpshufb_avx2(auVar110,auVar90);
          auVar47 = vpshufb_avx2(auVar110,auVar99);
          auVar113 = vpmaddubsw_avx2(auVar113,auVar22);
          auVar30 = vpmaddubsw_avx2(auVar30,auVar28);
          auVar113 = vpaddw_avx2(auVar113,auVar30);
          auVar30 = vpmaddubsw_avx2(auVar111,auVar39);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar45);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar113 = vpaddw_avx2(auVar113,auVar30);
          auVar112._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
          auVar112._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
          auVar30 = vpshufb_avx2(auVar112,auVar64);
          auVar111 = vpshufb_avx2(auVar112,auVar79);
          auVar47 = vpshufb_avx2(auVar112,auVar90);
          auVar70 = vpshufb_avx2(auVar112,auVar99);
          auVar30 = vpmaddubsw_avx2(auVar30,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar111,auVar28);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar70,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar113 = vpaddw_avx2(auVar113,auVar106);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar30,auVar106);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          *(undefined1 (*) [16])dst = auVar113._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar113._16_16_;
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
          h = h + -2;
        } while (h != 0);
        break;
      default:
        pauVar8 = (undefined1 (*) [32])(src + 0x65);
        pauVar4 = (undefined1 (*) [32])(dst + 0x60);
        auVar67._16_16_ = _DAT_00517c80;
        auVar67._0_16_ = _DAT_00517c80;
        auVar82._16_16_ = _DAT_00517860;
        auVar82._0_16_ = _DAT_00517860;
        auVar93._16_16_ = _DAT_00517870;
        auVar93._0_16_ = _DAT_00517870;
        auVar101._16_16_ = _DAT_005186b0;
        auVar101._0_16_ = _DAT_005186b0;
        auVar108._8_2_ = 0x22;
        auVar108._0_8_ = 0x22002200220022;
        auVar108._10_2_ = 0x22;
        auVar108._12_2_ = 0x22;
        auVar108._14_2_ = 0x22;
        auVar108._16_2_ = 0x22;
        auVar108._18_2_ = 0x22;
        auVar108._20_2_ = 0x22;
        auVar108._22_2_ = 0x22;
        auVar108._24_2_ = 0x22;
        auVar108._26_2_ = 0x22;
        auVar108._28_2_ = 0x22;
        auVar108._30_2_ = 0x22;
        do {
          auVar113 = *(undefined1 (*) [32])(pauVar8[-4] + 0x18);
          auVar30 = pauVar8[-3];
          auVar111 = vpshufb_avx2(auVar113,auVar67);
          auVar47 = vpshufb_avx2(auVar113,auVar82);
          auVar70 = vpshufb_avx2(auVar113,auVar93);
          auVar83 = vpshufb_avx2(auVar113,auVar101);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpshufb_avx2(auVar30,auVar67);
          auVar47 = vpshufb_avx2(auVar30,auVar82);
          auVar70 = vpshufb_avx2(auVar30,auVar93);
          auVar83 = vpshufb_avx2(auVar30,auVar101);
          auVar30 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar113 = vpaddw_avx2(auVar113,auVar108);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar30,auVar108);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          pauVar4[-3] = auVar113;
          auVar113 = *(undefined1 (*) [32])(pauVar8[-3] + 0x18);
          auVar30 = pauVar8[-2];
          auVar111 = vpshufb_avx2(auVar113,auVar67);
          auVar47 = vpshufb_avx2(auVar113,auVar82);
          auVar70 = vpshufb_avx2(auVar113,auVar93);
          auVar83 = vpshufb_avx2(auVar113,auVar101);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpshufb_avx2(auVar30,auVar67);
          auVar47 = vpshufb_avx2(auVar30,auVar82);
          auVar70 = vpshufb_avx2(auVar30,auVar93);
          auVar83 = vpshufb_avx2(auVar30,auVar101);
          auVar30 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar113 = vpaddw_avx2(auVar113,auVar108);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar30,auVar108);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          pauVar4[-2] = auVar113;
          auVar113 = *(undefined1 (*) [32])(pauVar8[-2] + 0x18);
          auVar30 = pauVar8[-1];
          auVar111 = vpshufb_avx2(auVar113,auVar67);
          auVar47 = vpshufb_avx2(auVar113,auVar82);
          auVar70 = vpshufb_avx2(auVar113,auVar93);
          auVar83 = vpshufb_avx2(auVar113,auVar101);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpshufb_avx2(auVar30,auVar67);
          auVar47 = vpshufb_avx2(auVar30,auVar82);
          auVar70 = vpshufb_avx2(auVar30,auVar93);
          auVar83 = vpshufb_avx2(auVar30,auVar101);
          auVar30 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar113 = vpaddw_avx2(auVar113,auVar108);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar30,auVar108);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          pauVar4[-1] = auVar113;
          auVar113 = *(undefined1 (*) [32])(pauVar8[-1] + 0x18);
          auVar30 = *pauVar8;
          auVar111 = vpshufb_avx2(auVar113,auVar67);
          auVar47 = vpshufb_avx2(auVar113,auVar82);
          auVar70 = vpshufb_avx2(auVar113,auVar93);
          auVar83 = vpshufb_avx2(auVar113,auVar101);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpshufb_avx2(auVar30,auVar67);
          auVar47 = vpshufb_avx2(auVar30,auVar82);
          auVar70 = vpshufb_avx2(auVar30,auVar93);
          auVar83 = vpshufb_avx2(auVar30,auVar101);
          auVar30 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar113 = vpaddw_avx2(auVar113,auVar108);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar30,auVar108);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          *pauVar4 = auVar113;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
          h = h + -1;
        } while (h != 0);
        break;
      case 3:
        pauVar4 = (undefined1 (*) [32])(src + 5);
        auVar63._16_16_ = _DAT_00517c80;
        auVar63._0_16_ = _DAT_00517c80;
        auVar78._16_16_ = _DAT_00517860;
        auVar78._0_16_ = _DAT_00517860;
        auVar89._16_16_ = _DAT_00517870;
        auVar89._0_16_ = _DAT_00517870;
        auVar98._16_16_ = _DAT_005186b0;
        auVar98._0_16_ = _DAT_005186b0;
        auVar105._8_2_ = 0x22;
        auVar105._0_8_ = 0x22002200220022;
        auVar105._10_2_ = 0x22;
        auVar105._12_2_ = 0x22;
        auVar105._14_2_ = 0x22;
        auVar105._16_2_ = 0x22;
        auVar105._18_2_ = 0x22;
        auVar105._20_2_ = 0x22;
        auVar105._22_2_ = 0x22;
        auVar105._24_2_ = 0x22;
        auVar105._26_2_ = 0x22;
        auVar105._28_2_ = 0x22;
        auVar105._30_2_ = 0x22;
        do {
          auVar113 = *(undefined1 (*) [32])(pauVar4[-1] + 0x18);
          auVar30 = *pauVar4;
          auVar111 = vpshufb_avx2(auVar113,auVar63);
          auVar47 = vpshufb_avx2(auVar113,auVar78);
          auVar70 = vpshufb_avx2(auVar113,auVar89);
          auVar83 = vpshufb_avx2(auVar113,auVar98);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpshufb_avx2(auVar30,auVar63);
          auVar47 = vpshufb_avx2(auVar30,auVar78);
          auVar70 = vpshufb_avx2(auVar30,auVar89);
          auVar83 = vpshufb_avx2(auVar30,auVar98);
          auVar30 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar113 = vpaddw_avx2(auVar113,auVar105);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar30,auVar105);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          *(undefined1 (*) [32])dst = auVar113;
          dst = *(undefined1 (*) [32])dst + dst_stride;
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + src_stride);
          h = h + -1;
        } while (h != 0);
        break;
      case 7:
        pauVar8 = (undefined1 (*) [32])(src + 0x25);
        pauVar4 = (undefined1 (*) [32])(dst + 0x20);
        auVar65._16_16_ = _DAT_00517c80;
        auVar65._0_16_ = _DAT_00517c80;
        auVar80._16_16_ = _DAT_00517860;
        auVar80._0_16_ = _DAT_00517860;
        auVar91._16_16_ = _DAT_00517870;
        auVar91._0_16_ = _DAT_00517870;
        auVar100._16_16_ = _DAT_005186b0;
        auVar100._0_16_ = _DAT_005186b0;
        auVar107._8_2_ = 0x22;
        auVar107._0_8_ = 0x22002200220022;
        auVar107._10_2_ = 0x22;
        auVar107._12_2_ = 0x22;
        auVar107._14_2_ = 0x22;
        auVar107._16_2_ = 0x22;
        auVar107._18_2_ = 0x22;
        auVar107._20_2_ = 0x22;
        auVar107._22_2_ = 0x22;
        auVar107._24_2_ = 0x22;
        auVar107._26_2_ = 0x22;
        auVar107._28_2_ = 0x22;
        auVar107._30_2_ = 0x22;
        do {
          auVar113 = *(undefined1 (*) [32])(pauVar8[-2] + 0x18);
          auVar30 = pauVar8[-1];
          auVar111 = vpshufb_avx2(auVar113,auVar65);
          auVar47 = vpshufb_avx2(auVar113,auVar80);
          auVar70 = vpshufb_avx2(auVar113,auVar91);
          auVar83 = vpshufb_avx2(auVar113,auVar100);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpshufb_avx2(auVar30,auVar65);
          auVar47 = vpshufb_avx2(auVar30,auVar80);
          auVar70 = vpshufb_avx2(auVar30,auVar91);
          auVar83 = vpshufb_avx2(auVar30,auVar100);
          auVar30 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar113 = vpaddw_avx2(auVar113,auVar107);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar30,auVar107);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          pauVar4[-1] = auVar113;
          auVar113 = *(undefined1 (*) [32])(pauVar8[-1] + 0x18);
          auVar30 = *pauVar8;
          auVar111 = vpshufb_avx2(auVar113,auVar65);
          auVar47 = vpshufb_avx2(auVar113,auVar80);
          auVar70 = vpshufb_avx2(auVar113,auVar91);
          auVar83 = vpshufb_avx2(auVar113,auVar100);
          auVar113 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar113 = vpaddw_avx2(auVar113,auVar111);
          auVar111 = vpshufb_avx2(auVar30,auVar65);
          auVar47 = vpshufb_avx2(auVar30,auVar80);
          auVar70 = vpshufb_avx2(auVar30,auVar91);
          auVar83 = vpshufb_avx2(auVar30,auVar100);
          auVar30 = vpmaddubsw_avx2(auVar111,auVar22);
          auVar111 = vpmaddubsw_avx2(auVar47,auVar28);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar111 = vpmaddubsw_avx2(auVar70,auVar39);
          auVar47 = vpmaddubsw_avx2(auVar83,auVar45);
          auVar111 = vpaddw_avx2(auVar111,auVar47);
          auVar30 = vpaddw_avx2(auVar30,auVar111);
          auVar113 = vpaddw_avx2(auVar113,auVar107);
          auVar111 = vpsraw_avx2(auVar113,6);
          auVar113 = vpaddw_avx2(auVar30,auVar107);
          auVar113 = vpsraw_avx2(auVar113,6);
          auVar113 = vpackuswb_avx2(auVar111,auVar113);
          *pauVar4 = auVar113;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
          h = h + -1;
        } while (h != 0);
      }
    }
  }
  return;
}

Assistant:

void av1_convolve_x_sr_avx2(const uint8_t *src, int32_t src_stride,
                            uint8_t *dst, int32_t dst_stride, int32_t w,
                            int32_t h,
                            const InterpFilterParams *filter_params_x,
                            const int32_t subpel_x_qn,
                            ConvolveParams *conv_params) {
#if CONFIG_SVT_AV1
  const int horz_tap = get_filter_tap(filter_params_x, subpel_x_qn);

  if (horz_tap == 12) {
    av1_convolve_x_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_x, subpel_x_qn, conv_params);
  } else {
    av1_convolve_x_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                       filter_params_x, subpel_x_qn,
                                       conv_params);
  }
#else
  av1_convolve_x_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_x, subpel_x_qn, conv_params);
#endif
}